

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSetMmapLimit(Btree *p,sqlite3_int64 szMmap)

{
  BtShared *pBVar1;
  BtShared *pBt;
  sqlite3_int64 szMmap_local;
  Btree *p_local;
  
  pBVar1 = p->pBt;
  sqlite3BtreeEnter(p);
  sqlite3PagerSetMmapLimit(pBVar1->pPager,szMmap);
  sqlite3BtreeLeave(p);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetMmapLimit(Btree *p, sqlite3_int64 szMmap){
  BtShared *pBt = p->pBt;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  sqlite3PagerSetMmapLimit(pBt->pPager, szMmap);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}